

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O0

Key * __thiscall QPixmapCache::Key::operator=(Key *this,Key *other)

{
  KeyData *pKVar1;
  int iVar2;
  long *in_RSI;
  Key *in_RDI;
  
  if (in_RDI->d != (KeyData *)*in_RSI) {
    if (*in_RSI != 0) {
      *(int *)(*in_RSI + 0x20) = *(int *)(*in_RSI + 0x20) + 1;
    }
    if (((in_RDI->d != (KeyData *)0x0) &&
        (iVar2 = in_RDI->d->ref + -1, in_RDI->d->ref = iVar2, iVar2 == 0)) &&
       (pKVar1 = in_RDI->d, pKVar1 != (KeyData *)0x0)) {
      KeyData::~KeyData((KeyData *)0x3271a3);
      operator_delete(pKVar1,0x28);
    }
    in_RDI->d = (KeyData *)*in_RSI;
  }
  return in_RDI;
}

Assistant:

QPixmapCache::Key &QPixmapCache::Key::operator =(const Key &other)
{
    if (d != other.d) {
        if (other.d)
            ++(other.d->ref);
        if (d && --(d->ref) == 0)
            delete d;
        d = other.d;
    }
    return *this;
}